

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

test_suite * init_unit_test_suite(int param_1,char **param_2)

{
  test_suite *this;
  size_t sVar1;
  BufferTestSuite *this_00;
  const_string local_40;
  const_string local_30;
  
  this = (test_suite *)operator_new(0x180);
  local_30.m_begin = "Buffer Unit Tests";
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length("Buffer Unit Tests")
  ;
  local_30.m_end = "Buffer Unit Tests" + sVar1;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                    );
  local_40.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + sVar1;
  boost::unit_test::test_suite::test_suite(this,&local_30,&local_40,0x47c);
  this_00 = (BufferTestSuite *)operator_new(0x180);
  BufferTestSuite::BufferTestSuite(this_00);
  boost::unit_test::test_suite::add(this,&(this_00->super_test_suite).super_test_unit,0,0);
  return this;
}

Assistant:

boost::unit_test::test_suite*
init_unit_test_suite( int, char* [] ) 
{
    boost::unit_test::test_suite *test (BOOST_TEST_SUITE ("Buffer Unit Tests"));
    test->add (new BufferTestSuite() );

    return test;
}